

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::Internals::PushDefinitions(Internals *this)

{
  cmDefinitions local_48;
  Internals *local_10;
  Internals *this_local;
  
  local_48.Map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_48.Map._M_h._M_rehash_policy._4_4_ = 0;
  local_48.Map._M_h._M_rehash_policy._M_next_resize = 0;
  local_48.Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_48.Map._M_h._M_element_count = 0;
  local_48.Map._M_h._M_buckets = (__buckets_ptr)0x0;
  local_48.Map._M_h._M_bucket_count = 0;
  local_48.Map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_10 = this;
  cmDefinitions::cmDefinitions(&local_48);
  std::__cxx11::list<cmDefinitions,_std::allocator<cmDefinitions>_>::push_back
            (&this->VarStack,&local_48);
  cmDefinitions::~cmDefinitions(&local_48);
  return;
}

Assistant:

void PushDefinitions()
  {
    this->VarStack.push_back(cmDefinitions());
  }